

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  Descriptor *pDVar1;
  string *psVar2;
  MethodOptions *pMVar3;
  MethodOptions *pMVar4;
  MethodDescriptor *in_RDI;
  char *in_stack_00000068;
  MethodDescriptorProto *in_stack_00000070;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  MethodOptions *in_stack_ffffffffffffffc0;
  
  name_abi_cxx11_(in_RDI);
  MethodDescriptorProto::set_name
            ((MethodDescriptorProto *)in_stack_ffffffffffffffc0,
             (string *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  pDVar1 = input_type((MethodDescriptor *)0x493f1e);
  if (((byte)pDVar1[0x89] & 1) == 0) {
    MethodDescriptorProto::set_input_type(in_stack_00000070,in_stack_00000068);
  }
  psVar2 = MethodDescriptorProto::mutable_input_type_abi_cxx11_((MethodDescriptorProto *)0x493f42);
  pDVar1 = input_type((MethodDescriptor *)0x493f51);
  Descriptor::full_name_abi_cxx11_(pDVar1);
  std::__cxx11::string::append((string *)psVar2);
  pDVar1 = output_type((MethodDescriptor *)0x493f70);
  if (((byte)pDVar1[0x89] & 1) == 0) {
    MethodDescriptorProto::set_output_type(in_stack_00000070,in_stack_00000068);
  }
  psVar2 = MethodDescriptorProto::mutable_output_type_abi_cxx11_((MethodDescriptorProto *)0x493f94);
  pDVar1 = output_type((MethodDescriptor *)0x493fa3);
  Descriptor::full_name_abi_cxx11_(pDVar1);
  std::__cxx11::string::append((string *)psVar2);
  pMVar3 = options(in_RDI);
  pMVar4 = MethodOptions::default_instance();
  if (pMVar3 != pMVar4) {
    in_stack_ffffffffffffffc0 =
         MethodDescriptorProto::mutable_options((MethodDescriptorProto *)0x493fe3);
    options(in_RDI);
    MethodOptions::CopyFrom
              (in_stack_ffffffffffffffc0,
               (MethodOptions *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if (((byte)in_RDI[0x60] & 1) != 0) {
    MethodDescriptorProto::set_client_streaming
              ((MethodDescriptorProto *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  }
  if (((byte)in_RDI[0x61] & 1) != 0) {
    MethodDescriptorProto::set_server_streaming
              ((MethodDescriptorProto *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}